

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false,true>>>
::
Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>>
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false,true>>>
           *this,Column_settings *colSettings,
          function<bool_(unsigned_int,_unsigned_int)> *birthComparator,
          function<bool_(unsigned_int,_unsigned_int)> *deathComparator)

{
  undefined8 *puVar1;
  _Any_data local_60;
  code *local_50;
  undefined8 uStack_48;
  _Any_data local_40;
  code *local_30;
  undefined8 uStack_28;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined4 *)(this + 0x18) = 0xffffffff;
  std::function<bool_(unsigned_int,_unsigned_int)>::function
            ((function<bool_(unsigned_int,_unsigned_int)> *)&local_60,birthComparator);
  std::function<bool_(unsigned_int,_unsigned_int)>::function
            ((function<bool_(unsigned_int,_unsigned_int)> *)&local_40,deathComparator);
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = uStack_48;
  if (local_50 != (code *)0x0) {
    *(void **)(this + 0x20) = local_60._M_unused._M_object;
    *(undefined8 *)(this + 0x28) = local_60._8_8_;
    *(code **)(this + 0x30) = local_50;
    local_50 = (code *)0x0;
    uStack_48 = 0;
  }
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x58) = uStack_28;
  if (local_30 != (code *)0x0) {
    *(void **)(this + 0x40) = local_40._M_unused._M_object;
    *(undefined8 *)(this + 0x48) = local_40._8_8_;
    *(code **)(this + 0x50) = local_30;
    local_30 = (code *)0x0;
    uStack_28 = 0;
  }
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  *(undefined8 *)(this + 0x80) = 0;
  *(undefined8 *)(this + 0x88) = 0;
  *(undefined8 *)(this + 0x70) = 0;
  *(undefined8 *)(this + 0x78) = 0;
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined8 *)(this + 0x68) = 0;
  puVar1 = (undefined8 *)operator_new(0x30);
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[3] = puVar1 + 1;
  puVar1[4] = puVar1 + 1;
  puVar1[5] = 0;
  *(undefined8 **)(this + 0x90) = puVar1;
  *(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false,true>>>
    **)(this + 0x98) = this + 200;
  *(undefined8 *)(this + 0xa0) = 1;
  *(undefined8 *)(this + 0xa8) = 0;
  *(undefined8 *)(this + 0xb0) = 0;
  *(undefined4 *)(this + 0xb8) = 0x3f800000;
  *(undefined8 *)(this + 0xc0) = 0;
  *(undefined8 *)(this + 200) = 0;
  *(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false,true>>>
    **)(this + 0xd0) = this + 0x100;
  *(undefined8 *)(this + 0xd8) = 1;
  *(undefined8 *)(this + 0xe0) = 0;
  *(undefined8 *)(this + 0xe8) = 0;
  *(undefined4 *)(this + 0xf0) = 0x3f800000;
  *(undefined8 *)(this + 0xf8) = 0;
  *(undefined8 *)(this + 0x100) = 0;
  *(undefined4 *)(this + 0x108) = 0;
  *(Column_settings **)(this + 0x110) = colSettings;
  return;
}

Assistant:

inline Chain_matrix<Master_matrix>::Chain_matrix(Column_settings* colSettings,
                                                 const BirthComparatorFunction& birthComparator,
                                                 const DeathComparatorFunction& deathComparator)
    : Dim_opt(Master_matrix::template get_null_value<Dimension>()),
      Pair_opt(),
      Swap_opt(birthComparator, deathComparator),
      Rep_opt(),
      RA_opt(),
      nextIndex_(0),
      colSettings_(colSettings)
{}